

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *hs,uint8_t *out_alert,CBS *contents)

{
  SSL *ssl;
  ssl_ctx_st *psVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  Array<unsigned_char> *this;
  ptrdiff_t _Num;
  ulong new_size;
  uint8_t selected_len;
  uint8_t *selected;
  byte local_51;
  uint8_t *local_50;
  size_t local_48;
  CBS local_40;
  
  if (contents == (CBS *)0x0) {
LAB_0013d9fa:
    bVar2 = true;
  }
  else {
    ssl = hs->ssl;
    uVar3 = ssl_protocol_version(ssl);
    if (uVar3 < 0x304) {
      if ((ssl->s3->field_0xdc & 0x10) != 0) {
        __assert_fail("!ssl->s3->initial_handshake_complete",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x483,
                      "bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      iVar4 = SSL_is_dtls(ssl);
      if (iVar4 != 0) {
        __assert_fail("!SSL_is_dtls(ssl)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x484,
                      "bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      if (((ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->next_proto_select_cb ==
          (_func_int_SSL_ptr_uint8_t_ptr_ptr_uint8_t_ptr_uint8_t_ptr_uint_void_ptr *)0x0) {
        __assert_fail("ssl->ctx->next_proto_select_cb != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x485,
                      "bool bssl::ext_npn_parse_serverhello(SSL_HANDSHAKE *, uint8_t *, CBS *)");
      }
      if ((ssl->s3->alpn_selected).size_ != 0) {
        *out_alert = '/';
        ERR_put_error(0x10,0,0xaa,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x48a);
        return false;
      }
      local_50 = contents->data;
      local_48 = contents->len;
      if (local_48 != 0) {
        do {
          iVar4 = CBS_get_u8_length_prefixed(contents,&local_40);
          if (iVar4 == 0) {
            return false;
          }
          if (local_40.len == 0) {
            return false;
          }
        } while (contents->len != 0);
      }
      psVar1 = (ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
      iVar4 = (*psVar1->next_proto_select_cb)
                        (ssl,&local_40.data,&local_51,local_50,(uint)local_48,
                         psVar1->next_proto_select_cb_arg);
      if (iVar4 == 0) {
        this = &ssl->s3->next_proto_negotiated;
        local_50 = local_40.data;
        new_size = (ulong)local_51;
        bVar2 = Array<unsigned_char>::InitUninitialized(this,new_size);
        if (bVar2 && new_size != 0) {
          memmove(this->data_,local_50,new_size);
        }
        if (bVar2) {
          hs->field_0x6c9 = hs->field_0x6c9 | 0x80;
          goto LAB_0013d9fa;
        }
      }
      *out_alert = 'P';
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool ext_npn_parse_serverhello(SSL_HANDSHAKE *hs, uint8_t *out_alert,
                                      CBS *contents) {
  SSL *const ssl = hs->ssl;
  if (contents == NULL) {
    return true;
  }

  if (ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    return false;
  }

  // If any of these are false then we should never have sent the NPN
  // extension in the ClientHello and thus this function should never have been
  // called.
  assert(!ssl->s3->initial_handshake_complete);
  assert(!SSL_is_dtls(ssl));
  assert(ssl->ctx->next_proto_select_cb != NULL);

  if (!ssl->s3->alpn_selected.empty()) {
    // NPN and ALPN may not be negotiated in the same connection.
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    OPENSSL_PUT_ERROR(SSL, SSL_R_NEGOTIATED_BOTH_NPN_AND_ALPN);
    return false;
  }

  const uint8_t *const orig_contents = CBS_data(contents);
  const size_t orig_len = CBS_len(contents);

  while (CBS_len(contents) != 0) {
    CBS proto;
    if (!CBS_get_u8_length_prefixed(contents, &proto) ||  //
        CBS_len(&proto) == 0) {
      return false;
    }
  }

  // |orig_len| fits in |unsigned| because TLS extensions use 16-bit lengths.
  uint8_t *selected;
  uint8_t selected_len;
  if (ssl->ctx->next_proto_select_cb(
          ssl, &selected, &selected_len, orig_contents,
          static_cast<unsigned>(orig_len),
          ssl->ctx->next_proto_select_cb_arg) != SSL_TLSEXT_ERR_OK ||
      !ssl->s3->next_proto_negotiated.CopyFrom(Span(selected, selected_len))) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  hs->next_proto_neg_seen = true;
  return true;
}